

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O2

void __thiscall Battle::playerTurn(Battle *this)

{
  bool turnAgain;
  int y;
  int x;
  bool local_29;
  int local_28;
  int local_24;
  
  local_29 = true;
  do {
    Player::areaNavigate(this->player,&local_24,&local_28);
    Player::attack(this->player,this->enemy,local_24,local_28,&local_29);
  } while (local_29 != false);
  return;
}

Assistant:

void Battle::playerTurn() {
    int x,y;
    bool turnAgain = true;
    do {
        player->areaNavigate(x,y);
        player->attack(*enemy,x,y,turnAgain);
    } while (turnAgain);

}